

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathTranslateFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  ulong uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  uint uVar6;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr obj_00;
  xmlXPathObjectPtr obj_01;
  xmlBufPtr buf;
  byte *pbVar7;
  xmlChar *val;
  xmlXPathObjectPtr value;
  unsigned_long opCount;
  byte *utfchar;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 3) {
    iVar4 = 0xc;
LAB_001c2ad3:
    xmlXPathErr(ctxt,iVar4);
    return;
  }
  if (ctxt->valueNr < 3) {
    iVar4 = 0x17;
    goto LAB_001c2ad3;
  }
  if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
    xmlXPathStringFunction(ctxt,1);
  }
  obj = xmlXPathValuePop(ctxt);
  if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
    xmlXPathStringFunction(ctxt,1);
  }
  obj_00 = xmlXPathValuePop(ctxt);
  if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
    xmlXPathStringFunction(ctxt,1);
  }
  obj_01 = xmlXPathValuePop(ctxt);
  if (ctxt->error != 0) goto LAB_001c2b5e;
  if (ctxt->context->opLimit != 0) {
    iVar4 = xmlStrlen(obj_00->stringval);
    iVar5 = xmlStrlen(obj_01->stringval);
    if (iVar5 == 0 || iVar4 == 0) {
LAB_001c2c22:
      uVar6 = 0;
    }
    else {
      uVar1 = (ulong)(long)iVar5 / 10 + 1;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar1;
      opCount = ((ulong)(long)iVar4 / 10 + 1) * uVar1;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar3,0) <=
          (ulong)(long)iVar4 / 10) {
        opCount = 0xffffffffffffffff;
      }
      uVar6 = xmlXPathCheckOpLimit(ctxt,opCount);
      if (-1 < (int)uVar6) goto LAB_001c2c22;
      uVar6 = uVar6 >> 0x1e & 0xfffffffe;
    }
    if (uVar6 != 0) goto LAB_001c2b5e;
  }
  buf = xmlBufCreate(0x32);
  if (buf == (xmlBufPtr)0x0) {
    xmlXPathPErrMemory(ctxt);
  }
  else {
    iVar4 = xmlUTF8Strlen(obj->stringval);
    pbVar7 = obj_01->stringval;
    do {
      do {
        utfchar = pbVar7;
        bVar2 = *utfchar;
        if (bVar2 == 0) goto LAB_001c2d21;
        iVar5 = xmlUTF8Strloc(obj_00->stringval,utfchar);
        pbVar7 = utfchar;
        if ((iVar5 < 0) ||
           ((iVar5 < iVar4 && (pbVar7 = xmlUTF8Strpos(obj->stringval,iVar5), pbVar7 != (byte *)0x0))
           )) {
          iVar5 = xmlUTF8Strsize(pbVar7,1);
          xmlBufAdd(buf,pbVar7,(long)iVar5);
        }
        pbVar7 = utfchar + 1;
      } while (-1 < (char)bVar2);
      if ((~bVar2 & 0xc0) != 0) {
        xmlXPathErr(ctxt,0x15);
        break;
      }
      if ((bVar2 & 0x40) != 0) {
        pbVar7 = utfchar + 2;
        xmlXPathErr(ctxt,0x15);
      }
    } while ((bVar2 & 0x40) == 0);
LAB_001c2d21:
    val = xmlBufDetach(buf);
    if (val == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
    }
    else {
      value = xmlXPathCacheWrapString(ctxt,val);
      xmlXPathValuePush(ctxt,value);
    }
    xmlBufFree(buf);
  }
LAB_001c2b5e:
  xmlXPathReleaseObject(ctxt->context,obj_01);
  xmlXPathReleaseObject(ctxt->context,obj_00);
  xmlXPathReleaseObject(ctxt->context,obj);
  return;
}

Assistant:

void
xmlXPathTranslateFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr str = NULL;
    xmlXPathObjectPtr from = NULL;
    xmlXPathObjectPtr to = NULL;
    xmlBufPtr target;
    int offset, max;
    int ch;
    const xmlChar *point;
    xmlChar *cptr, *content;

    CHECK_ARITY(3);

    CAST_TO_STRING;
    to = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    from = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    str = xmlXPathValuePop(ctxt);
    if (ctxt->error != 0)
        goto error;

    /*
     * Account for quadratic runtime
     */
    if (ctxt->context->opLimit != 0) {
        unsigned long f1 = xmlStrlen(from->stringval);
        unsigned long f2 = xmlStrlen(str->stringval);

        if ((f1 > 0) && (f2 > 0)) {
            unsigned long p;

            f1 = f1 / 10 + 1;
            f2 = f2 / 10 + 1;
            p = f1 > ULONG_MAX / f2 ? ULONG_MAX : f1 * f2;
            if (xmlXPathCheckOpLimit(ctxt, p) < 0)
                goto error;
        }
    }

    target = xmlBufCreate(50);
    if (target == NULL) {
        xmlXPathPErrMemory(ctxt);
        goto error;
    }

    max = xmlUTF8Strlen(to->stringval);
    for (cptr = str->stringval; (ch=*cptr); ) {
        offset = xmlUTF8Strloc(from->stringval, cptr);
        if (offset >= 0) {
            if (offset < max) {
                point = xmlUTF8Strpos(to->stringval, offset);
                if (point)
                    xmlBufAdd(target, point, xmlUTF8Strsize(point, 1));
            }
        } else
            xmlBufAdd(target, cptr, xmlUTF8Strsize(cptr, 1));

        /* Step to next character in input */
        cptr++;
        if ( ch & 0x80 ) {
            /* if not simple ascii, verify proper format */
            if ( (ch & 0xc0) != 0xc0 ) {
                xmlXPathErr(ctxt, XPATH_INVALID_CHAR_ERROR);
                break;
            }
            /* then skip over remaining bytes for this char */
            while ( (ch <<= 1) & 0x80 )
                if ( (*cptr++ & 0xc0) != 0x80 ) {
                    xmlXPathErr(ctxt, XPATH_INVALID_CHAR_ERROR);
                    break;
                }
            if (ch & 0x80) /* must have had error encountered */
                break;
        }
    }

    content = xmlBufDetach(target);
    if (content == NULL)
        xmlXPathPErrMemory(ctxt);
    else
        xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, content));
    xmlBufFree(target);
error:
    xmlXPathReleaseObject(ctxt->context, str);
    xmlXPathReleaseObject(ctxt->context, from);
    xmlXPathReleaseObject(ctxt->context, to);
}